

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O2

void __thiscall
HashtableTest_SimpleDataTypeOptimizations_Test::TestBody
          (HashtableTest_SimpleDataTypeOptimizations_Test *this)

{
  value_type *pvVar1;
  value_type *pvVar2;
  value_type *pvVar3;
  int iVar4;
  char *pcVar5;
  AssertionResult gtest_ar;
  long *local_1b0;
  int local_1a8;
  key_equal local_1a0;
  int nomemmove_copies;
  int memmove_nonstandard_alloc_copies;
  int memmove_copies;
  sparse_hash_map<int,_NoMemmove,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_NoMemmove>_>_>
  nomemmove;
  sparse_hash_map<int,_Memmove,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  memmove_nonstandard_alloc;
  sparse_hash_map<int,_Memmove,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_Memmove>_>_>
  memmove;
  
  memmove_nonstandard_alloc.rep.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
  super_Hasher.id_ = 0;
  memmove_nonstandard_alloc.rep.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
  super_Hasher.num_hashes_ = 0;
  memmove_nonstandard_alloc.rep.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
  super_Hasher.num_compares_ = 0;
  nomemmove.rep.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher.id_
       = 0;
  nomemmove.rep.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher.
  num_hashes_ = 0;
  nomemmove.rep.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher.
  num_compares_ = 0;
  google::
  sparse_hash_map<int,_Memmove,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_Memmove>_>_>
  ::sparse_hash_map(&memmove,0,(hasher *)&memmove_nonstandard_alloc,(key_equal *)&nomemmove,
                    (allocator_type *)&gtest_ar);
  memmove_nonstandard_alloc.rep.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
  super_Hasher.id_ = 0;
  memmove_nonstandard_alloc.rep.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
  super_Hasher.num_hashes_ = 0;
  memmove_nonstandard_alloc.rep.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
  super_Hasher.num_compares_ = 0;
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )((ulong)gtest_ar.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl._4_4_ << 0x20);
  google::
  sparse_hash_map<int,_NoMemmove,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_NoMemmove>_>_>
  ::sparse_hash_map(&nomemmove,0,(hasher *)&memmove_nonstandard_alloc,(key_equal *)&gtest_ar,
                    (allocator_type *)&local_1b0);
  local_1b0 = (long *)0x0;
  local_1a8 = 0;
  local_1a0.id_ = 0;
  local_1a0.num_hashes_ = 0;
  local_1a0.num_compares_ = 0;
  gtest_ar._0_8_ = gtest_ar._0_8_ & 0xffffffff00000000;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  google::
  sparse_hash_map<int,_Memmove,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::sparse_hash_map(&memmove_nonstandard_alloc,0,(hasher *)&local_1b0,&local_1a0,
                    (allocator_type *)&gtest_ar);
  Memmove::num_copies = 0;
  iVar4 = 10000;
  while (gtest_ar._0_4_ = iVar4, 0 < iVar4) {
    pvVar1 = google::
             sparse_hashtable<std::pair<int_const,Memmove>,int,Hasher,google::sparse_hash_map<int,Memmove,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,Memmove>>>::SelectKey,google::sparse_hash_map<int,Memmove,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,Memmove>>>::SetKey,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,Memmove>>>
             ::
             find_or_insert<google::sparse_hash_map<int,Memmove,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,Memmove>>>::DefaultValue>
                       ((sparse_hashtable<std::pair<int_const,Memmove>,int,Hasher,google::sparse_hash_map<int,Memmove,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,Memmove>>>::SelectKey,google::sparse_hash_map<int,Memmove,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,Memmove>>>::SetKey,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,Memmove>>>
                         *)&memmove,(key_type *)&gtest_ar);
    (pvVar1->second).i = iVar4;
    iVar4 = gtest_ar._0_4_ + -1;
  }
  NoMemmove::num_copies = 0;
  memmove_copies = Memmove::num_copies;
  iVar4 = 10000;
  while (gtest_ar._0_4_ = iVar4, 0 < iVar4) {
    pvVar2 = google::
             sparse_hashtable<std::pair<int_const,NoMemmove>,int,Hasher,google::sparse_hash_map<int,NoMemmove,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,NoMemmove>>>::SelectKey,google::sparse_hash_map<int,NoMemmove,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,NoMemmove>>>::SetKey,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,NoMemmove>>>
             ::
             find_or_insert<google::sparse_hash_map<int,NoMemmove,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,NoMemmove>>>::DefaultValue>
                       ((sparse_hashtable<std::pair<int_const,NoMemmove>,int,Hasher,google::sparse_hash_map<int,NoMemmove,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,NoMemmove>>>::SelectKey,google::sparse_hash_map<int,NoMemmove,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,NoMemmove>>>::SetKey,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,NoMemmove>>>
                         *)&nomemmove,(key_type *)&gtest_ar);
    (pvVar2->second).i = iVar4;
    iVar4 = gtest_ar._0_4_ + -1;
  }
  Memmove::num_copies = 0;
  nomemmove_copies = NoMemmove::num_copies;
  iVar4 = 10000;
  while (gtest_ar._0_4_ = iVar4, 0 < iVar4) {
    pvVar3 = google::
             sparse_hashtable<std::pair<int_const,Memmove>,int,Hasher,google::sparse_hash_map<int,Memmove,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SelectKey,google::sparse_hash_map<int,Memmove,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
             ::
             find_or_insert<google::sparse_hash_map<int,Memmove,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::DefaultValue>
                       ((sparse_hashtable<std::pair<int_const,Memmove>,int,Hasher,google::sparse_hash_map<int,Memmove,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SelectKey,google::sparse_hash_map<int,Memmove,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
                         *)&memmove_nonstandard_alloc,(key_type *)&gtest_ar);
    (pvVar3->second).i = iVar4;
    iVar4 = gtest_ar._0_4_ + -1;
  }
  memmove_nonstandard_alloc_copies = Memmove::num_copies;
  testing::internal::CmpHelperGT<int,int>
            ((internal *)&gtest_ar,"nomemmove_copies","memmove_copies",&nomemmove_copies,
             &memmove_copies);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_1b0);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x699,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1a0,(Message *)&local_1b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1a0);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_1b0 !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*local_1b0 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"nomemmove_copies","memmove_nonstandard_alloc_copies",
             &nomemmove_copies,&memmove_nonstandard_alloc_copies);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_1b0);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x69a,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1a0,(Message *)&local_1b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1a0);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0 !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*local_1b0 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::
  vector<google::sparsegroup<std::pair<const_int,_Memmove>,_(unsigned_short)48,_Alloc<std::pair<const_int,_Memmove>,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<std::pair<const_int,_Memmove>,_(unsigned_short)48,_Alloc<std::pair<const_int,_Memmove>,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  ::~vector(&memmove_nonstandard_alloc.rep.table.groups);
  std::
  vector<google::sparsegroup<std::pair<const_int,_NoMemmove>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_NoMemmove>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_int,_NoMemmove>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_NoMemmove>_>_>_>_>
  ::~vector(&nomemmove.rep.table.groups);
  std::
  vector<google::sparsegroup<std::pair<const_int,_Memmove>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_Memmove>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_int,_Memmove>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_Memmove>_>_>_>_>
  ::~vector(&memmove.rep.table.groups);
  return;
}

Assistant:

TEST(HashtableTest, SimpleDataTypeOptimizations) {
  // Only sparsehashtable optimizes moves in this way.
  sparse_hash_map<int, Memmove, Hasher, Hasher> memmove;
  sparse_hash_map<int, NoMemmove, Hasher, Hasher> nomemmove;
  sparse_hash_map<int, Memmove, Hasher, Hasher, Alloc<int>>
      memmove_nonstandard_alloc;

  Memmove::num_copies = 0;
  for (int i = 10000; i > 0; i--) {
    memmove[i] = Memmove(i);
  }
  const int memmove_copies = Memmove::num_copies;

  NoMemmove::num_copies = 0;
  for (int i = 10000; i > 0; i--) {
    nomemmove[i] = NoMemmove(i);
  }
  const int nomemmove_copies = NoMemmove::num_copies;

  Memmove::num_copies = 0;
  for (int i = 10000; i > 0; i--) {
    memmove_nonstandard_alloc[i] = Memmove(i);
  }
  const int memmove_nonstandard_alloc_copies = Memmove::num_copies;

  EXPECT_GT(nomemmove_copies, memmove_copies);
  EXPECT_EQ(nomemmove_copies, memmove_nonstandard_alloc_copies);
}